

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall ON_HistoryRecord::Internal_ReadV5(ON_HistoryRecord *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  uint uVar2;
  RECORD_TYPE RVar3;
  byte local_81;
  ON__INT32 local_74;
  ON_Value *pOStack_70;
  int rec_type;
  ON_Value *value;
  ON__INT32 local_60;
  int value_id;
  int value_type;
  int mnv;
  int mjv;
  int count;
  int i;
  int value_id0;
  int mnvs;
  int mjvs;
  unsigned_short uStack_38;
  unsigned_short uStack_36;
  bool bSortDescendantsAferRead;
  ON_UUID record_id;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_HistoryRecord *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  operator=(this,&Empty);
  iStack_24 = 0;
  record_id.Data4[4] = '\0';
  record_id.Data4[5] = '\0';
  record_id.Data4[6] = '\0';
  record_id.Data4[7] = '\0';
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,(int *)(record_id.Data4 + 4)
                    );
  if (bVar1) {
    record_id.Data4[3] = iStack_24 == 1;
    if ((bool)record_id.Data4[3]) {
      mjvs = 0;
      uStack_38 = 0;
      uStack_36 = 0;
      record_id._0_8_ = (uchar  [8])0x0;
      record_id.Data4[3] = ON_BinaryArchive::ReadUuid(_minor_version,(ON_UUID *)&mjvs);
      if ((bool)record_id.Data4[3]) {
        ON_ModelComponent::SetId(&this->super_ON_ModelComponent,(ON_UUID *)&mjvs);
        record_id.Data4[3] = ON_BinaryArchive::ReadInt(_minor_version,&this->m_version);
        if (((bool)record_id.Data4[3]) &&
           (record_id.Data4[3] = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_command_id),
           (bool)record_id.Data4[3])) {
          mnvs._3_1_ = 0;
          record_id.Data4[3] = ON_UuidList::Read(&this->m_descendants,_minor_version,false);
          if (((bool)record_id.Data4[3]) &&
             (record_id.Data4[3] = ON_UuidList::Read(&this->m_antecedents,_minor_version),
             (bool)record_id.Data4[3])) {
            value_id0 = 0;
            i = 0;
            count = 0;
            record_id.Data4[3] =
                 ON_BinaryArchive::BeginRead3dmChunk(_minor_version,0x40008000,&value_id0,&i);
            if ((bool)record_id.Data4[3]) {
              record_id.Data4[3] = value_id0 == 1;
              mnv = 0;
              if ((bool)record_id.Data4[3]) {
                record_id.Data4[3] = ON_BinaryArchive::ReadInt(_minor_version,&mnv);
              }
              if (record_id.Data4[3] != '\0') {
                ON_SimpleArray<ON_Value_*>::Reserve(&this->m_value,(long)mnv);
              }
              mjv = 0;
              while( true ) {
                local_81 = 0;
                if (mjv < mnv) {
                  local_81 = record_id.Data4[3];
                }
                if ((local_81 & 1) == 0) break;
                value_type = 0;
                value_id = 0;
                record_id.Data4[3] =
                     ON_BinaryArchive::BeginRead3dmChunk
                               (_minor_version,0x40008000,&value_type,&value_id);
                if (!(bool)record_id.Data4[3]) break;
                record_id.Data4[3] = value_type == 1;
                if ((bool)record_id.Data4[3]) {
                  local_60 = 0;
                  record_id.Data4[3] = ON_BinaryArchive::ReadInt(_minor_version,&local_60);
                  if ((bool)record_id.Data4[3]) {
                    value._4_4_ = 0;
                    record_id.Data4[3] =
                         ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)((long)&value + 4));
                    if (((bool)record_id.Data4[3]) &&
                       (pOStack_70 = ON_Value::CreateValue(local_60), pOStack_70 != (ON_Value *)0x0)
                       ) {
                      pOStack_70->m_value_id = value._4_4_;
                      uVar2 = (*pOStack_70->_vptr_ON_Value[4])(pOStack_70,_minor_version);
                      record_id.Data4[3] = (byte)uVar2 & 1;
                      if ((uVar2 & 1) == 0) {
                        if (pOStack_70 != (ON_Value *)0x0) {
                          (*pOStack_70->_vptr_ON_Value[1])();
                        }
                      }
                      else {
                        ON_SimpleArray<ON_Value_*>::Append(&this->m_value,&stack0xffffffffffffff90);
                        if (count < pOStack_70->m_value_id) {
                          count = pOStack_70->m_value_id;
                        }
                        else {
                          this->m_bValuesSorted = false;
                        }
                      }
                    }
                  }
                }
                bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
                if (!bVar1) {
                  record_id.Data4[3] = '\0';
                }
                mjv = mjv + 1;
              }
              bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
              if (!bVar1) {
                record_id.Data4[3] = '\0';
              }
            }
            if (((record_id.Data4[3] & 1) != 0) && (0 < (int)record_id.Data4._4_4_)) {
              local_74 = 0;
              if ((record_id.Data4[3] & 1) != 0) {
                record_id.Data4[3] = ON_BinaryArchive::ReadInt(_minor_version,&local_74);
              }
              if ((record_id.Data4[3] & 1) != 0) {
                RVar3 = RecordType(local_74);
                this->m_record_type = RVar3;
              }
              if (((record_id.Data4[3] & 1) != 0) && (1 < (int)record_id.Data4._4_4_)) {
                ON_BinaryArchive::ReadBool(_minor_version,&this->m_bCopyOnReplaceObject);
              }
            }
          }
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      record_id.Data4[3] = '\0';
    }
    this_local._7_1_ = (bool)(record_id.Data4[3] & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_HistoryRecord::Internal_ReadV5( ON_BinaryArchive& archive )
{
  *this = ON_HistoryRecord::Empty;

  // put entire history record in a chunk
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    ON_UUID record_id = ON_nil_uuid;
    rc = archive.ReadUuid(record_id);
    if(!rc) break;
    SetId(record_id);

    rc = archive.ReadInt(&m_version);
    if(!rc) break;

    rc = archive.ReadUuid(m_command_id);
    if(!rc) break;

    // 16 October 2012 Dale Lear
    //   Fixing http://dev.mcneel.com/bugtrack/?q=101403
    // Changing bSortDescendantsAfterRead from true to false
    // per discussion in the bug report. 
    const bool bSortDescendantsAferRead = false;
    rc = m_descendants.Read(archive,bSortDescendantsAferRead);
    if(!rc) break;

    rc = m_antecedents.Read(archive);
    if(!rc) break;

    // all values are in a chunk
    int mjvs=0,mnvs=0;
    int value_id0 = 0;
    rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjvs,&mnvs);
    if (rc)
    {
      rc = ( 1 == mjvs );

      int i, count = 0;
      if (rc) 
        rc = archive.ReadInt(&count);

      if (rc)
        m_value.Reserve(count);

      for ( i = 0; i < count && rc; i++ )
      {
        int mjv=0,mnv=0;
        rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjv,&mnv);
        if ( !rc)
          break;
        for(;;)
        {
          rc = ( 1 == mjv);
          if (!rc) break;
          int value_type = ON_Value::no_value_type;
          rc = archive.ReadInt(&value_type);
          if (!rc) 
            break;

          int value_id = 0;
          rc = archive.ReadInt(&value_id);
          if (!rc) 
            break;

          ON_Value* value = ON_Value::CreateValue(value_type);
          if ( value )
          {        
            value->m_value_id = value_id;
            rc = value->ReadHelper(archive);
            if (!rc) 
            {
              delete value;
              break;
            }
            m_value.Append(value);
            if ( value->m_value_id <= value_id0 )
              m_bValuesSorted = false;
            else
              value_id0 = value->m_value_id;
          }

          break;
        }
        if (!archive.EndRead3dmChunk())
          rc = false;
      }

      // end of all values
      if (!archive.EndRead3dmChunk())
        rc = false;
    }

    if ( rc && minor_version >= 1 )
    {
      // 1.1 fields added to opennurbs version 200603200
      int rec_type = (int)ON_HistoryRecord::RECORD_TYPE::history_parameters;
      if (rc)
        rc = archive.ReadInt( &rec_type );
      if (rc )
        m_record_type = RecordType(rec_type);

      if (rc && minor_version >= 2)
      {
        archive.ReadBool(&m_bCopyOnReplaceObject);
      }

    }

    break;
  }

  // end of entire history record in a chunk
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}